

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncurses_display_driver.cpp
# Opt level: O1

void __thiscall NcursesDisplayDriver::check_capabilities(NcursesDisplayDriver *this)

{
  WINDOW *pWVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = tigetstr("sitm");
  if (lVar2 != 0) {
    lVar2 = tigetstr("ritm");
    if (lVar2 != 0) {
      return;
    }
  }
  werase(this->_display_window);
  iVar3 = 0;
  wattr_set(this->_display_window,0,4,0);
  wprintw(this->_display_window,"Italics capability not detected for this terminal");
  pWVar1 = this->_display_window;
  if (pWVar1 != (WINDOW *)0x0) {
    iVar3 = pWVar1->_cury + 1;
  }
  wmove(pWVar1,iVar3,0);
  wprintw(this->_display_window,"Press any key to continue");
  wrefresh(this->_display_window);
  sleep(1);
  wgetch(_stdscr);
  return;
}

Assistant:

void NcursesDisplayDriver::check_capabilities(void) const {
	if (!tigetstr("sitm") or !tigetstr("ritm")) {
		werase(_display_window);
		wattr_set(_display_window, A_NORMAL, RED_PAIR, nullptr);
		wprintw(_display_window, "Italics capability not detected for this terminal");
		int y, x; // x required for getyx
		getyx(_display_window, y, x);
		wmove(_display_window, y+1, 0);
		wprintw(_display_window, "Press any key to continue");
		wrefresh(_display_window);
		sleep(1);
		getch();
	}
}